

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void pmevcntr_rawwrite(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  byte counter_00;
  uint32_t uVar1;
  uint8_t counter;
  uint64_t value_local;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  counter_00 = (ri->crm & 3) << 3 | ri->opc2 & 7;
  uVar1 = pmu_num_counters(env);
  if (counter_00 < uVar1) {
    (env->cp15).c14_pmevcntr[counter_00] = value;
    pmevcntr_write(env,ri,value,counter_00);
    return;
  }
  __assert_fail("counter < pmu_num_counters(env)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
                ,0x617,"void pmevcntr_rawwrite(CPUARMState *, const ARMCPRegInfo *, uint64_t)");
}

Assistant:

static void pmevcntr_rawwrite(CPUARMState *env, const ARMCPRegInfo *ri,
                             uint64_t value)
{
    uint8_t counter = ((ri->crm & 3) << 3) | (ri->opc2 & 7);
    assert(counter < pmu_num_counters(env));
    env->cp15.c14_pmevcntr[counter] = value;
    pmevcntr_write(env, ri, value, counter);
}